

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O2

uint8 * __thiscall
Messages::AddressBook::_InternalSerialize
          (AddressBook *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  uint8 *puVar2;
  Type *this_00;
  int index;
  
  iVar1 = (this->people_).super_RepeatedPtrFieldBase.current_size_;
  for (index = 0; iVar1 != index; index = index + 1) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<Messages::Person>::TypeHandler>
                        (&(this->people_).super_RepeatedPtrFieldBase,index);
    *puVar2 = '\n';
    puVar2 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray
                       ((this_00->_cached_size_).size_.super___atomic_base<int>._M_i,puVar2 + 1);
    target = Person::_InternalSerialize(this_00,puVar2,stream);
  }
  if ((*(ulong *)&this->field_0x8 & 1) == 0) {
    return target;
  }
  puVar2 = (uint8 *)google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                              ((UnknownFieldSet *)
                               ((*(ulong *)&this->field_0x8 & 0xfffffffffffffffe) + 8),target,stream
                              );
  return puVar2;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* AddressBook::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:Messages.AddressBook)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .Messages.Person people = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_people_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(1, this->_internal_people(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:Messages.AddressBook)
  return target;
}